

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O0

uint __thiscall
KarpRabinHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  size_type sVar1;
  byte *pbVar2;
  uint local_28;
  uint local_24;
  uint j;
  uint x;
  uint k;
  uint answer;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *c_local;
  KarpRabinHash<unsigned_int,_unsigned_char> *this_local;
  
  x = 0;
  j = 0;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar1 <= j) break;
    local_24 = 1;
    local_28 = 0;
    while( true ) {
      sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
      if ((sVar1 - 1) - (ulong)j <= (ulong)local_28) break;
      local_24 = local_24 * 0x25 & *(uint *)(this + 0x40c);
      local_28 = local_28 + 1;
    }
    pbVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[](c,(ulong)j);
    x = x + (local_24 * *(int *)(this + (ulong)*pbVar2 * 4 + 0xc) & *(uint *)(this + 0x40c)) &
        *(uint *)(this + 0x40c);
    j = j + 1;
  }
  return x;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }